

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::keyValueDisplayName
          (LocaleDisplayNamesImpl *this,char *key,char *value,UnicodeString *result,UBool skipAdjust
          )

{
  UBool UVar1;
  int iVar2;
  char16_t *currency;
  char *locale;
  UChar *srcChars;
  LocaleDisplayNamesImpl *local_e8;
  UnicodeString *local_e0;
  LocaleDisplayNamesImpl *local_d0;
  UChar *currencyName;
  undefined1 local_78 [3];
  UBool isChoice;
  int32_t len;
  UnicodeString ustrValue;
  UErrorCode sts;
  UBool skipAdjust_local;
  UnicodeString *result_local;
  char *value_local;
  char *key_local;
  LocaleDisplayNamesImpl *this_local;
  
  ustrValue.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = skipAdjust;
  iVar2 = strcmp(key,"currency");
  if (iVar2 == 0) {
    ustrValue.fUnion._48_4_ = 0;
    UnicodeString::UnicodeString((UnicodeString *)local_78,value,-1,kInvariant);
    currencyName._3_1_ = 0;
    currency = UnicodeString::getTerminatedBuffer((UnicodeString *)local_78);
    locale = Locale::getBaseName(&this->locale);
    srcChars = ucurr_getName_63(currency,locale,UCURR_LONG_NAME,(UBool *)((long)&currencyName + 3),
                                (int32_t *)((long)&currencyName + 4),
                                (UErrorCode *)(ustrValue.fUnion.fStackFields.fBuffer + 0x17));
    UVar1 = ::U_FAILURE(ustrValue.fUnion._48_4_);
    if (UVar1 == '\0') {
      UnicodeString::setTo(result,srcChars,currencyName._4_4_);
      local_d0 = (LocaleDisplayNamesImpl *)result;
      if (ustrValue.fUnion.fStackFields.fBuffer[0x1a]._1_1_ == '\0') {
        local_d0 = (LocaleDisplayNamesImpl *)
                   adjustForUsageAndContext(this,kCapContextUsageKeyValue,result);
      }
      this_local = local_d0;
    }
    else {
      UnicodeString::operator=(result,(UnicodeString *)local_78);
      this_local = (LocaleDisplayNamesImpl *)result;
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_78);
  }
  else {
    if (this->nameLength == UDISPCTX_LENGTH_SHORT) {
      ICUDataTable::get(&this->langData,"Types%short",key,value,result);
      UVar1 = UnicodeString::isBogus(result);
      if (UVar1 == '\0') {
        local_e0 = result;
        if (ustrValue.fUnion.fStackFields.fBuffer[0x1a]._1_1_ == '\0') {
          local_e0 = adjustForUsageAndContext(this,kCapContextUsageKeyValue,result);
        }
        return local_e0;
      }
    }
    ICUDataTable::get(&this->langData,"Types",key,value,result);
    local_e8 = (LocaleDisplayNamesImpl *)result;
    if (ustrValue.fUnion.fStackFields.fBuffer[0x1a]._1_1_ == '\0') {
      local_e8 = (LocaleDisplayNamesImpl *)
                 adjustForUsageAndContext(this,kCapContextUsageKeyValue,result);
    }
    this_local = local_e8;
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::keyValueDisplayName(const char* key,
                                            const char* value,
                                            UnicodeString& result,
                                            UBool skipAdjust) const {
    if (uprv_strcmp(key, "currency") == 0) {
        // ICU4C does not have ICU4J CurrencyDisplayInfo equivalent for now.
        UErrorCode sts = U_ZERO_ERROR;
        UnicodeString ustrValue(value, -1, US_INV);
        int32_t len;
        UBool isChoice = FALSE;
        const UChar *currencyName = ucurr_getName(ustrValue.getTerminatedBuffer(),
            locale.getBaseName(), UCURR_LONG_NAME, &isChoice, &len, &sts);
        if (U_FAILURE(sts)) {
            // Return the value as is on failure
            result = ustrValue;
            return result;
        }
        result.setTo(currencyName, len);
        return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageKeyValue, result);
    }

    if (nameLength == UDISPCTX_LENGTH_SHORT) {
        langData.get("Types%short", key, value, result);
        if (!result.isBogus()) {
            return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageKeyValue, result);
        }
    }
    langData.get("Types", key, value, result);
    return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageKeyValue, result);
}